

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_WideFormatString_Test::TestBody(FormatterTest_WideFormatString_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  wchar_t (*in_stack_fffffffffffffe78) [4];
  wchar_t (*expected) [2];
  char *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int line;
  char *in_stack_fffffffffffffe90;
  wchar_t *file;
  undefined8 in_stack_fffffffffffffe98;
  Type TVar3;
  AssertHelper *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  wchar_t in_stack_fffffffffffffee8 [2];
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_f8 [2];
  wstring local_d8 [32];
  AssertionResult local_b8 [2];
  undefined8 local_98;
  wstring local_90 [32];
  AssertionResult local_70 [3];
  undefined4 local_3c;
  wstring local_38 [32];
  AssertionResult local_18;
  
  TVar3 = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_3c = 0x2a;
  fmt::v5::format<wchar_t[3],int>
            ((wchar_t (*) [3])CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (int *)in_stack_fffffffffffffea0);
  testing::internal::EqHelper<false>::Compare<wchar_t[3],std::__cxx11::wstring>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,(wchar_t (*) [3])in_stack_fffffffffffffe78,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::wstring::~wstring(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    testing::AssertionResult::failure_message((AssertionResult *)0x173e6e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,TVar3,in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x173ecb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x173f23);
  local_98 = 0x4010cccccccccccd;
  fmt::v5::format<wchar_t[3],double>
            ((wchar_t (*) [3])CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (double *)in_stack_fffffffffffffea0);
  testing::internal::EqHelper<false>::Compare<wchar_t[4],std::__cxx11::wstring>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::wstring::~wstring(local_90);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    in_stack_fffffffffffffea0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x17401b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,TVar3,in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x174078);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1740d0);
  file = L"abc";
  TVar3 = (Type)((ulong)local_d8 >> 0x20);
  fmt::v5::format<wchar_t[3],wchar_t[4]>
            ((wchar_t (*) [3])CONCAT17(uVar2,in_stack_fffffffffffffea8),
             (wchar_t (*) [4])in_stack_fffffffffffffea0);
  testing::internal::EqHelper<false>::Compare<wchar_t[4],std::__cxx11::wstring>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::wstring::~wstring(local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    in_stack_fffffffffffffe80 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1741b8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,TVar3,(char *)file,line,in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x174215);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17426d);
  expected = (wchar_t (*) [2])&stack0xfffffffffffffee8;
  fmt::v5::format<wchar_t[3],wchar_t>
            ((wchar_t (*) [3])CONCAT17(uVar2,in_stack_fffffffffffffea8),
             (wchar_t *)in_stack_fffffffffffffea0);
  testing::internal::EqHelper<false>::Compare<wchar_t[2],std::__cxx11::wstring>
            ((char *)CONCAT44(line,in_stack_fffffffffffffe88),in_stack_fffffffffffffe80,expected,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::wstring::~wstring((wstring *)&stack0xfffffffffffffee8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_f8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    testing::AssertionResult::failure_message((AssertionResult *)0x174355);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,TVar3,(char *)file,line,in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x1743a1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1743f0);
  return;
}

Assistant:

TEST(FormatterTest, WideFormatString) {
  EXPECT_EQ(L"42", format(L"{}", 42));
  EXPECT_EQ(L"4.2", format(L"{}", 4.2));
  EXPECT_EQ(L"abc", format(L"{}", L"abc"));
  EXPECT_EQ(L"z", format(L"{}", L'z'));
}